

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

CommandSignature __thiscall
llbuild::buildsystem::ExternalCommand::getSignature(ExternalCommand *this)

{
  pointer ppBVar1;
  StringRef string;
  StringRef string_00;
  CommandSignature *pCVar2;
  size_t in_RDX;
  pointer ppBVar3;
  StringRef S;
  CommandSignature local_28;
  
  S.Length = in_RDX;
  S.Data = (char *)(this->super_Command).name._M_string_length;
  local_28.value = (uint64_t)llvm::hash_value((llvm *)(this->super_Command).name._M_dataplus._M_p,S)
  ;
  ppBVar1 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar3 = (this->super_Command).inputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar3 != ppBVar1;
      ppBVar3 = ppBVar3 + 1) {
    string.Data = ((*ppBVar3)->super_Node).name._M_dataplus._M_p;
    string.Length = ((*ppBVar3)->super_Node).name._M_string_length;
    pCVar2 = basic::CommandSignature::combine(&local_28,string);
    local_28.value = pCVar2->value;
  }
  ppBVar1 = (this->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar3 = (this->super_Command).outputs.
                 super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar3 != ppBVar1;
      ppBVar3 = ppBVar3 + 1) {
    string_00.Data = ((*ppBVar3)->super_Node).name._M_dataplus._M_p;
    string_00.Length = ((*ppBVar3)->super_Node).name._M_string_length;
    pCVar2 = basic::CommandSignature::combine(&local_28,string_00);
    local_28.value = pCVar2->value;
  }
  pCVar2 = basic::CommandSignature::combine(&local_28,this->allowMissingInputs);
  pCVar2 = basic::CommandSignature::combine(pCVar2,this->allowModifiedOutputs);
  pCVar2 = basic::CommandSignature::combine(pCVar2,this->alwaysOutOfDate);
  return (CommandSignature)pCVar2->value;
}

Assistant:

CommandSignature ExternalCommand::getSignature() const {
  CommandSignature code(getName());
  for (const auto* input: inputs) {
    code = code.combine(input->getName());
  }
  for (const auto* output: outputs) {
    code = code.combine(output->getName());
  }
  return code
      .combine(allowMissingInputs)
      .combine(allowModifiedOutputs)
      .combine(alwaysOutOfDate);
}